

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O3

void If_ManResetOriginalRefs(If_Man_t *p)

{
  int *piVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  pVVar3 = p->vObjs;
  iVar2 = pVVar3->nSize;
  lVar6 = (long)iVar2;
  if (0 < lVar6) {
    ppvVar4 = pVVar3->pArray;
    lVar7 = 0;
    do {
      *(undefined4 *)((long)ppvVar4[lVar7] + 0xc) = 0;
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
    if (0 < iVar2) {
      ppvVar4 = pVVar3->pArray;
      lVar7 = 0;
      do {
        puVar5 = (uint *)ppvVar4[lVar7];
        if ((*puVar5 & 0xf) == 3) {
          lVar8 = 0x18;
LAB_0043f9f7:
          piVar1 = (int *)(*(long *)((long)puVar5 + lVar8) + 0xc);
          *piVar1 = *piVar1 + 1;
        }
        else if ((*puVar5 & 0xf) == 4) {
          *(int *)(*(long *)(puVar5 + 6) + 0xc) = *(int *)(*(long *)(puVar5 + 6) + 0xc) + 1;
          lVar8 = 0x20;
          goto LAB_0043f9f7;
        }
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
    }
  }
  return;
}

Assistant:

void If_ManResetOriginalRefs( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i;
    If_ManForEachObj( p, pObj, i )
        pObj->nRefs = 0;
    If_ManForEachObj( p, pObj, i )
    {
        if ( If_ObjIsAnd(pObj) )
        {
            pObj->pFanin0->nRefs++;
            pObj->pFanin1->nRefs++;
        }
        else if ( If_ObjIsCo(pObj) )
            pObj->pFanin0->nRefs++;
    }
}